

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O3

int tcc_output_file(TCCState *s,char *filename)

{
  byte bVar1;
  Section *pSVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  Section *pSVar6;
  sym_attr *psVar7;
  Section *pSVar8;
  size_t sVar9;
  unsigned_long uVar10;
  size_t sVar11;
  ulong uVar12;
  undefined4 *ptr;
  FILE *__s;
  long *plVar13;
  Section **ppSVar14;
  undefined8 *__src;
  void *pvVar15;
  undefined8 *puVar16;
  uint uVar17;
  uchar *puVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  byte *pbVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  undefined4 *puVar27;
  long lVar28;
  uchar *puVar29;
  ulong uVar30;
  int iVar31;
  uchar *puVar32;
  char *pcVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint *puVar37;
  uint *puVar38;
  ulong uVar39;
  Elf64_Addr EVar40;
  long lVar41;
  dyn_inf local_168;
  undefined8 local_138;
  long lStack_130;
  Elf64_Addr local_128;
  unsigned_long uStack_120;
  unsigned_long local_118;
  undefined8 uStack_110;
  long local_108;
  long lStack_100;
  long local_f0;
  undefined8 uStack_e8;
  Elf64_Ehdr ehdr;
  unsigned_long local_98;
  int local_78;
  undefined4 *local_70;
  Section *local_58;
  Section *local_50;
  ulong local_40;
  
  local_168.data_offset = 0;
  local_168.rel_addr = 0;
  local_168.dynamic = (Section *)0x0;
  local_168.dynstr = (Section *)0x0;
  local_168.rel_size = 0;
  uVar36 = s->output_type;
  s->nb_errors = 0;
  if (uVar36 == 4) {
    pSVar6 = (Section *)0x0;
    local_58 = (Section *)0x0;
    local_50 = (Section *)0x0;
  }
  else {
    tcc_add_runtime(s);
    resolve_common_syms(s);
    if (s->static_link == 0) {
      if (uVar36 == 2) {
        pcVar5 = getenv("LD_SO");
        pcVar33 = "/lib64/ld-linux-x86-64.so.2";
        if (pcVar5 != (char *)0x0) {
          pcVar33 = pcVar5;
        }
        pSVar6 = new_section(s,".interp",1,2);
        pSVar6->sh_addralign = 1;
        sVar11 = strlen(pcVar33);
        sVar9 = section_add(pSVar6,sVar11 + 1,1);
        strcpy((char *)(pSVar6->data + sVar9),pcVar33);
      }
      else {
        pSVar6 = (Section *)0x0;
      }
      pSVar8 = new_symtab(s,".dynsym",0xb,2,".dynstr",".hash",2);
      s->dynsym = pSVar8;
      local_50 = pSVar8->link;
      local_58 = new_section(s,".dynamic",6,3);
      local_58->link = local_50;
      local_58->sh_entsize = 0x10;
      build_got(s);
      uVar10 = symtab_section->data_offset;
      if (uVar36 == 2) {
        if (0x18 < (long)uVar10) {
          puVar32 = symtab_section->data + 0x18;
          puVar29 = symtab_section->data;
          do {
            puVar18 = puVar32;
            if (*(ushort *)(puVar29 + 0x1e) == 0) {
              puVar32 = symtab_section->link->data + *(uint *)(puVar29 + 0x18);
              pSVar8 = s->dynsymtab_section;
              iVar26 = find_elf_sym(pSVar8,(char *)puVar32);
              if (iVar26 == 0) {
                if (((puVar29[0x1c] & 0xf0) != 0x20) &&
                   (iVar26 = strcmp((char *)puVar32,"_fp_hw"), iVar26 != 0)) {
                  tcc_error_noabort("undefined symbol \'%s\'",puVar32);
                }
              }
              else {
                puVar29 = pSVar8->data;
                bVar1 = puVar29[(long)iVar26 * 0x18 + 4];
                if ((bVar1 & 7) == 2) {
                  iVar26 = put_elf_sym(s->dynsym,0,
                                       *(unsigned_long *)(puVar29 + (long)iVar26 * 0x18 + 0x10),0x12
                                       ,0,0,(char *)puVar32);
                  psVar7 = get_sym_attr(s,(int)((ulong)((long)puVar18 - (long)symtab_section->data)
                                               >> 3) * -0x55555555,1);
                  psVar7->dyn_index = iVar26;
                }
                else if ((bVar1 & 0xf) == 1) {
                  uVar12 = bss_section->data_offset + 0xf & 0xfffffffffffffff0;
                  set_elf_sym(s->symtab,uVar12,
                              *(unsigned_long *)(puVar29 + (long)iVar26 * 0x18 + 0x10),(uint)bVar1,0
                              ,bss_section->sh_num,(char *)puVar32);
                  iVar35 = put_elf_sym(s->dynsym,uVar12,
                                       *(unsigned_long *)(puVar29 + (long)iVar26 * 0x18 + 0x10),
                                       (uint)puVar29[(long)iVar26 * 0x18 + 4],0,bss_section->sh_num,
                                       (char *)puVar32);
                  if ((puVar29[(long)iVar26 * 0x18 + 4] & 0xf0) == 0x20) {
                    pSVar8 = s->dynsymtab_section;
                    if (0x18 < (long)pSVar8->data_offset) {
                      puVar38 = (uint *)(pSVar8->data + 0x18);
                      do {
                        if ((*(long *)(puVar38 + 2) == *(long *)(puVar29 + (long)iVar26 * 0x18 + 8))
                           && (((byte)puVar38[1] & 0xfffffff0) == 0x10)) {
                          put_elf_sym(s->dynsym,uVar12,*(unsigned_long *)(puVar38 + 4),
                                      (uint)(byte)puVar38[1],0,bss_section->sh_num,
                                      (char *)(pSVar8->link->data + *puVar38));
                          break;
                        }
                        puVar38 = puVar38 + 6;
                      } while (puVar38 < pSVar8->data + pSVar8->data_offset);
                    }
                  }
                  put_elf_reloca(s->dynsym,bss_section,uVar12,5,iVar35,0);
                  bss_section->data_offset =
                       uVar12 + *(long *)(puVar29 + (long)iVar26 * 0x18 + 0x10);
                }
              }
            }
            else if ((s->rdynamic != 0) && (0xf < puVar29[0x1c])) {
              set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar29 + 0x20),
                          *(unsigned_long *)(puVar29 + 0x28),(uint)puVar29[0x1c],0,
                          (uint)*(ushort *)(puVar29 + 0x1e),
                          (char *)(symtab_section->link->data + *(uint *)(puVar29 + 0x18)));
            }
            puVar32 = puVar18 + 0x18;
            puVar29 = puVar18;
          } while (puVar18 + 0x18 < symtab_section->data + symtab_section->data_offset);
        }
        if (s->nb_errors != 0) {
          iVar26 = -1;
          local_70 = (undefined4 *)0x0;
          ptr = (undefined4 *)0x0;
          goto LAB_0011240c;
        }
        pSVar8 = s->dynsymtab_section;
        if (0x18 < (long)pSVar8->data_offset) {
          puVar38 = (uint *)(pSVar8->data + 0x18);
          do {
            pSVar2 = symtab_section;
            puVar32 = pSVar8->link->data + *puVar38;
            iVar26 = find_elf_sym(symtab_section,(char *)puVar32);
            if (iVar26 == 0) {
LAB_001110ee:
              if ((*(short *)((long)puVar38 + 6) == 0) && ((puVar38[1] & 0xf0) != 0x20)) {
                tcc_warning("undefined dynamic symbol \'%s\'",puVar32);
              }
            }
            else {
              puVar29 = pSVar2->data;
              if ((*(ushort *)(puVar29 + (long)iVar26 * 0x18 + 6) == 0) ||
                 (puVar29[(long)iVar26 * 0x18 + 4] < 0x10)) goto LAB_001110ee;
              set_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar29 + (long)iVar26 * 0x18 + 8),
                          *(unsigned_long *)(puVar29 + (long)iVar26 * 0x18 + 0x10),
                          (uint)puVar29[(long)iVar26 * 0x18 + 4],0,
                          (uint)*(ushort *)(puVar29 + (long)iVar26 * 0x18 + 6),(char *)puVar32);
            }
            puVar38 = puVar38 + 6;
            pSVar8 = s->dynsymtab_section;
          } while (puVar38 < pSVar8->data + pSVar8->data_offset);
        }
      }
      else if (0x18 < (long)uVar10) {
        puVar37 = (uint *)(symtab_section->data + 0x18);
        pSVar8 = symtab_section;
        puVar38 = puVar37;
        do {
          if (0xf < (byte)puVar37[1]) {
            iVar26 = put_elf_sym(s->dynsym,*(Elf64_Addr *)(puVar37 + 2),
                                 *(unsigned_long *)(puVar37 + 4),(uint)(byte)puVar37[1],0,
                                 (uint)*(ushort *)((long)puVar37 + 6),
                                 (char *)(pSVar8->link->data + *puVar37));
            psVar7 = get_sym_attr(s,(int)((ulong)((long)puVar38 - (long)symtab_section->data) >> 3)
                                    * -0x55555555,1);
            psVar7->dyn_index = iVar26;
            uVar10 = symtab_section->data_offset;
            pSVar8 = symtab_section;
          }
          puVar37 = puVar37 + 6;
          puVar38 = puVar38 + 6;
        } while (puVar37 < pSVar8->data + uVar10);
      }
    }
    else {
      pSVar6 = (Section *)0x0;
      local_58 = (Section *)0x0;
      local_50 = (Section *)0x0;
    }
    build_got_entries(s);
  }
  pSVar8 = new_section(s,".shstrtab",3,0);
  uVar39 = 1;
  sVar9 = section_add(pSVar8,1,1);
  pSVar8->data[sVar9] = '\0';
  uVar12 = (ulong)(uint)s->nb_sections;
  bVar3 = true;
  if (1 < s->nb_sections) {
    bVar3 = false;
    do {
      pSVar2 = s->sections[uVar39];
      if ((((uVar36 == 3) && (pSVar2->sh_type == 4)) && ((pSVar2->sh_flags & 2U) == 0)) &&
         (((s->sections[pSVar2->sh_info]->sh_flags & 2) != 0 && (0 < (long)pSVar2->data_offset)))) {
        puVar32 = pSVar2->data;
        puVar29 = puVar32 + pSVar2->data_offset;
        iVar26 = 0;
        do {
          lVar41 = *(long *)(puVar32 + 8);
          iVar35 = (int)lVar41;
          if (iVar35 - 10U < 2) {
LAB_00111218:
            iVar26 = iVar26 + 1;
          }
          else if (iVar35 == 2) {
            lVar28 = lVar41 >> 0x20;
            if (s->nb_sym_attrs <= (int)((ulong)lVar41 >> 0x20)) {
              lVar28 = 0;
            }
            iVar26 = (iVar26 + 1) - (uint)(s->sym_attrs[lVar28].dyn_index == 0);
          }
          else if (iVar35 == 1) goto LAB_00111218;
          puVar32 = puVar32 + 0x18;
        } while (puVar32 < puVar29);
        if (iVar26 == 0) goto LAB_0011128e;
        pSVar2->sh_flags = pSVar2->sh_flags | 2;
        pSVar2->sh_size = (long)iVar26 * 0x18;
        if ((s->sections[pSVar2->sh_info]->sh_flags & 4) != 0) {
          bVar3 = true;
        }
LAB_001112c1:
        sVar11 = strlen(pSVar2->name);
        uVar10 = pSVar8->data_offset;
        EVar40 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
        sVar9 = section_add(pSVar8,EVar40,1);
        memmove(pSVar8->data + sVar9,pSVar2->name,EVar40);
        pSVar2->sh_name = (int)uVar10;
      }
      else {
LAB_0011128e:
        if (((uVar36 == 4) || (s->do_debug != 0)) ||
           (((pSVar2->sh_flags & 2) != 0 || (uVar39 == (int)uVar12 - 1)))) {
          uVar10 = pSVar2->data_offset;
          pSVar2->sh_size = uVar10;
        }
        else {
          uVar10 = pSVar2->sh_size;
        }
        if ((uVar10 != 0) || ((pSVar2->sh_flags & 2) != 0)) goto LAB_001112c1;
      }
      uVar39 = uVar39 + 1;
      uVar12 = (ulong)s->nb_sections;
    } while ((long)uVar39 < (long)uVar12);
    bVar3 = !bVar3;
  }
  pSVar8->sh_size = pSVar8->data_offset;
  if (local_58 == (Section *)0x0) {
    local_98 = 0;
  }
  else {
    iVar26 = s->nb_loaded_dlls;
    if (0 < iVar26) {
      lVar41 = 0;
      do {
        if (s->loaded_dlls[lVar41]->level == 0) {
          pcVar33 = s->loaded_dlls[lVar41]->name;
          sVar11 = strlen(pcVar33);
          uVar10 = local_50->data_offset;
          EVar40 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
          sVar9 = section_add(local_50,EVar40,1);
          memmove(local_50->data + sVar9,pcVar33,EVar40);
          sVar9 = section_add(local_58,0x10,1);
          puVar29 = local_58->data;
          puVar32 = puVar29 + sVar9;
          puVar32[0] = '\x01';
          puVar32[1] = '\0';
          puVar32[2] = '\0';
          puVar32[3] = '\0';
          puVar32[4] = '\0';
          puVar32[5] = '\0';
          puVar32[6] = '\0';
          puVar32[7] = '\0';
          *(long *)(puVar29 + sVar9 + 8) = (long)(int)uVar10;
          iVar26 = s->nb_loaded_dlls;
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 < iVar26);
    }
    pcVar33 = s->rpath;
    if (pcVar33 != (char *)0x0) {
      uVar19 = 0x1d;
      if (s->enable_new_dtags == 0) {
        uVar19 = 0xf;
      }
      sVar11 = strlen(pcVar33);
      uVar10 = local_50->data_offset;
      EVar40 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
      sVar9 = section_add(local_50,EVar40,1);
      memmove(local_50->data + sVar9,pcVar33,EVar40);
      sVar9 = section_add(local_58,0x10,1);
      puVar32 = local_58->data;
      *(undefined8 *)(puVar32 + sVar9) = uVar19;
      *(long *)(puVar32 + sVar9 + 8) = (long)(int)uVar10;
    }
    if (uVar36 == 3) {
      pcVar33 = s->soname;
      if (pcVar33 != (char *)0x0) {
        sVar11 = strlen(pcVar33);
        uVar10 = local_50->data_offset;
        EVar40 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
        sVar9 = section_add(local_50,EVar40,1);
        memmove(local_50->data + sVar9,pcVar33,EVar40);
        sVar9 = section_add(local_58,0x10,1);
        puVar29 = local_58->data;
        puVar32 = puVar29 + sVar9;
        puVar32[0] = '\x0e';
        puVar32[1] = '\0';
        puVar32[2] = '\0';
        puVar32[3] = '\0';
        puVar32[4] = '\0';
        puVar32[5] = '\0';
        puVar32[6] = '\0';
        puVar32[7] = '\0';
        *(long *)(puVar29 + sVar9 + 8) = (long)(int)uVar10;
      }
      if (!bVar3) {
        sVar9 = section_add(local_58,0x10,1);
        puVar29 = local_58->data;
        puVar32 = puVar29 + sVar9;
        puVar32[0] = '\x16';
        puVar32[1] = '\0';
        puVar32[2] = '\0';
        puVar32[3] = '\0';
        puVar32[4] = '\0';
        puVar32[5] = '\0';
        puVar32[6] = '\0';
        puVar32[7] = '\0';
        puVar29 = puVar29 + sVar9 + 8;
        puVar29[0] = '\0';
        puVar29[1] = '\0';
        puVar29[2] = '\0';
        puVar29[3] = '\0';
        puVar29[4] = '\0';
        puVar29[5] = '\0';
        puVar29[6] = '\0';
        puVar29[7] = '\0';
      }
    }
    if (s->symbolic != 0) {
      sVar9 = section_add(local_58,0x10,1);
      puVar29 = local_58->data;
      puVar32 = puVar29 + sVar9;
      puVar32[0] = '\x10';
      puVar32[1] = '\0';
      puVar32[2] = '\0';
      puVar32[3] = '\0';
      puVar32[4] = '\0';
      puVar32[5] = '\0';
      puVar32[6] = '\0';
      puVar32[7] = '\0';
      puVar29 = puVar29 + sVar9 + 8;
      puVar29[0] = '\0';
      puVar29[1] = '\0';
      puVar29[2] = '\0';
      puVar29[3] = '\0';
      puVar29[4] = '\0';
      puVar29[5] = '\0';
      puVar29[6] = '\0';
      puVar29[7] = '\0';
    }
    local_168.dynamic = local_58;
    local_168.dynstr = local_50;
    local_98 = local_58->data_offset;
    local_168.data_offset = local_98;
    fill_dynamic(s,&local_168);
    local_58->sh_size = local_58->data_offset;
    local_50->sh_size = local_50->data_offset;
  }
  uVar12 = 0;
  if (uVar36 != 4) {
    if (uVar36 == 3) {
      uVar12 = 3;
    }
    else {
      uVar12 = (ulong)((uint)(s->static_link == 0) * 3 + 2);
    }
  }
  iVar35 = (int)uVar12;
  uVar39 = (ulong)(uint)(iVar35 * 0x38);
  local_70 = (undefined4 *)tcc_mallocz(uVar39);
  local_f0 = (long)s->nb_sections;
  ptr = (undefined4 *)tcc_malloc(local_f0 * 4);
  *ptr = 0;
  uVar23 = iVar35 * 0x38 + 0x40;
  uVar34 = 0;
  if (s->output_format == 0) {
    uVar34 = uVar23;
  }
  uVar30 = 0x200000;
  if (s->section_align != 0) {
    uVar30 = (ulong)s->section_align;
  }
  if (iVar35 == 0) {
    iVar26 = 1;
  }
  else {
    local_78 = (int)uVar30;
    if (s->has_text_addr == 0) {
      EVar40 = (Elf64_Addr)(local_78 - 1U & uVar34 | (uint)(s->output_type != 3) << 0x16);
    }
    else {
      EVar40 = s->text_addr;
      uVar4 = (uint)EVar40 & local_78 - 1U;
      uVar17 = uVar34 & local_78 - 1U;
      iVar26 = 0;
      if ((int)uVar4 < (int)uVar17) {
        iVar26 = local_78;
      }
      uVar34 = (uVar34 - uVar17) + uVar4 + iVar26;
    }
    local_50 = (Section *)(uVar30 - 1);
    lVar41 = 0x70;
    if (pSVar6 == (Section *)0x0) {
      lVar41 = 0;
    }
    puVar27 = (undefined4 *)(lVar41 + (long)local_70);
    local_78 = local_78 + -1;
    iVar26 = 1;
    iVar31 = 1;
    local_40 = 0;
    local_168.rel_size = 0;
LAB_0011172c:
    *puVar27 = 1;
    puVar27[1] = 6 - iVar31;
    *(ulong *)(puVar27 + 0xc) = uVar30;
    uVar20 = (ulong)(uint)s->nb_sections;
    iVar24 = 0;
    do {
      if (1 < (int)uVar20) {
        lVar41 = 1;
        do {
          pSVar8 = s->sections[lVar41];
          uVar4 = pSVar8->sh_flags & 3;
          if (iVar31 == 0) {
            if (uVar4 == 3) goto LAB_0011178b;
          }
          else if (uVar4 == 2) {
LAB_0011178b:
            if (pSVar8 == pSVar6) {
              if (iVar24 == 0) goto LAB_001117d9;
            }
            else {
              switch(pSVar8->sh_type) {
              case 3:
              case 5:
              case 0xb:
                if (iVar24 == 1) {
LAB_001117d9:
                  ptr[iVar26] = (int)lVar41;
                  uVar20 = (long)-pSVar8->sh_addralign & (EVar40 + (long)pSVar8->sh_addralign) - 1;
                  uVar34 = uVar34 + ((int)uVar20 - (int)EVar40);
                  pSVar8->sh_offset = (long)(int)uVar34;
                  pSVar8->sh_addr = uVar20;
                  if (*(long *)(puVar27 + 2) == 0) {
                    *(long *)(puVar27 + 2) = (long)(int)uVar34;
                    *(ulong *)(puVar27 + 4) = uVar20;
                    *(ulong *)(puVar27 + 6) = uVar20;
                  }
                  iVar26 = iVar26 + 1;
                  if (pSVar8->sh_type == 4) {
                    if (local_168.rel_size == 0) {
                      local_40 = uVar20;
                    }
                    uVar10 = pSVar8->sh_size;
                    local_168.rel_size = local_168.rel_size + uVar10;
                    EVar40 = uVar20 + uVar10;
                  }
                  else {
                    uVar10 = pSVar8->sh_size;
                    EVar40 = uVar20 + uVar10;
                    if (pSVar8->sh_type == 8) break;
                  }
                  uVar34 = uVar34 + (int)uVar10;
                }
                break;
              case 4:
                if (iVar24 == 2) goto LAB_001117d9;
                break;
              default:
                if (iVar24 == 3) goto LAB_001117d9;
                break;
              case 8:
                if (iVar24 == 4) goto LAB_001117d9;
              }
            }
          }
          lVar41 = lVar41 + 1;
          uVar20 = (ulong)s->nb_sections;
        } while (lVar41 < (long)uVar20);
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 != 5);
    if (iVar31 != 0) {
      uVar20 = -*(long *)(puVar27 + 0xc);
      uVar25 = *(ulong *)(puVar27 + 2) & uVar20;
      *(ulong *)(puVar27 + 2) = uVar25;
      uVar21 = *(ulong *)(puVar27 + 4) & uVar20;
      *(ulong *)(puVar27 + 4) = uVar21;
      *(ulong *)(puVar27 + 6) = *(ulong *)(puVar27 + 6) & uVar20;
      *(ulong *)(puVar27 + 8) = (long)(int)uVar34 - uVar25;
      *(Elf64_Addr *)(puVar27 + 10) = EVar40 - uVar21;
      puVar27 = puVar27 + 0xe;
      if (s->output_format == 0) {
        uVar20 = EVar40 & (ulong)local_50;
        if ((EVar40 & (ulong)local_50) != 0) {
          uVar20 = uVar30;
        }
        EVar40 = EVar40 + uVar20;
        iVar31 = 0;
      }
      else {
        EVar40 = EVar40 + (long)local_50 & -uVar30;
        uVar34 = uVar34 + local_78 & (uint)-uVar30;
        iVar31 = 0;
      }
      goto LAB_0011172c;
    }
    local_168.rel_addr = local_40;
    *(ulong *)(puVar27 + 8) = (long)(int)uVar34 - *(ulong *)(puVar27 + 2);
    *(Elf64_Addr *)(puVar27 + 10) = EVar40 - *(ulong *)(puVar27 + 4);
  }
  if (1 < s->nb_sections) {
    lVar41 = 1;
    do {
      pSVar8 = s->sections[lVar41];
      if ((iVar35 == 0) || ((pSVar8->sh_flags & 2) == 0)) {
        lVar28 = (long)iVar26;
        iVar26 = iVar26 + 1;
        ptr[lVar28] = (int)lVar41;
        uVar34 = -pSVar8->sh_addralign & (uVar34 + pSVar8->sh_addralign) - 1;
        pSVar8->sh_offset = (long)(int)uVar34;
        if (pSVar8->sh_type != 8) {
          uVar34 = uVar34 + (int)pSVar8->sh_size;
        }
      }
      lVar41 = lVar41 + 1;
    } while (lVar41 < s->nb_sections);
  }
  if (uVar36 != 4) {
    if (pSVar6 != (Section *)0x0) {
      *local_70 = 6;
      *(undefined8 *)(local_70 + 2) = 0x40;
      *(ulong *)(local_70 + 10) = uVar39;
      *(ulong *)(local_70 + 8) = uVar39;
      lVar41 = pSVar6->sh_addr - uVar39;
      *(long *)(local_70 + 4) = lVar41;
      *(long *)(local_70 + 6) = lVar41;
      local_70[1] = 5;
      *(undefined8 *)(local_70 + 0xc) = 4;
      local_70[0xe] = 3;
      *(unsigned_long *)(local_70 + 0x10) = pSVar6->sh_offset;
      EVar40 = pSVar6->sh_addr;
      *(Elf64_Addr *)(local_70 + 0x12) = EVar40;
      *(Elf64_Addr *)(local_70 + 0x14) = EVar40;
      uVar10 = pSVar6->sh_size;
      *(unsigned_long *)(local_70 + 0x16) = uVar10;
      *(unsigned_long *)(local_70 + 0x18) = uVar10;
      local_70[0xf] = 4;
      *(long *)(local_70 + 0x1a) = (long)pSVar6->sh_addralign;
    }
    if (local_58 != (Section *)0x0) {
      local_70[uVar12 * 0xe + -0xe] = 2;
      *(unsigned_long *)(local_70 + uVar12 * 0xe + -0xc) = local_58->sh_offset;
      EVar40 = local_58->sh_addr;
      *(Elf64_Addr *)(local_70 + uVar12 * 0xe + -10) = EVar40;
      *(Elf64_Addr *)(local_70 + uVar12 * 0xe + -8) = EVar40;
      uVar10 = local_58->sh_size;
      *(unsigned_long *)(local_70 + uVar12 * 0xe + -6) = uVar10;
      *(unsigned_long *)(local_70 + uVar12 * 0xe + -4) = uVar10;
      local_70[uVar12 * 0xe + -0xd] = 6;
      *(long *)(local_70 + uVar12 * 0xe + -2) = (long)local_58->sh_addralign;
      local_58->data_offset = local_98;
      fill_dynamic(s,&local_168);
      *(int *)s->got->data = (int)local_58->sh_addr;
      if ((uVar36 & 0xfffffffe) == 2) {
        relocate_plt(s);
      }
      pSVar6 = s->dynsym;
      uVar10 = pSVar6->data_offset;
      if (0x18 < (long)uVar10) {
        puVar32 = pSVar6->data + 0x18;
        do {
          if ((ushort)(*(ushort *)(puVar32 + 6) - 1) < 0xfeff) {
            *(Elf64_Addr *)(puVar32 + 8) =
                 *(long *)(puVar32 + 8) + s->sections[*(ushort *)(puVar32 + 6)]->sh_addr;
            pSVar6 = s->dynsym;
            uVar10 = pSVar6->data_offset;
          }
          puVar32 = puVar32 + 0x18;
        } while (puVar32 < pSVar6->data + uVar10);
      }
    }
    relocate_syms(s,s->symtab,0);
    iVar26 = -1;
    if (s->nb_errors != 0) goto LAB_0011240c;
    iVar26 = s->nb_sections;
    lVar41 = (long)iVar26;
    if (1 < lVar41) {
      lVar28 = 1;
      do {
        pSVar6 = s->sections[lVar28];
        if ((pSVar6->reloc != (Section *)0x0) && (pSVar6 != s->got)) {
          relocate_section(s,pSVar6);
          iVar26 = s->nb_sections;
        }
        lVar28 = lVar28 + 1;
        lVar41 = (long)iVar26;
      } while (lVar28 < lVar41);
      if (1 < iVar26) {
        lVar28 = 1;
        do {
          pSVar6 = s->sections[lVar28];
          if ((((pSVar6->sh_flags & 2) != 0) && (pSVar6->sh_type == 4)) &&
             (0 < (long)pSVar6->data_offset)) {
            plVar13 = (long *)pSVar6->data;
            pSVar8 = s->sections[pSVar6->sh_info];
            do {
              *plVar13 = *plVar13 + pSVar8->sh_addr;
              plVar13 = plVar13 + 3;
            } while (plVar13 < pSVar6->data + pSVar6->data_offset);
            iVar26 = s->nb_sections;
          }
          lVar28 = lVar28 + 1;
          lVar41 = (long)iVar26;
        } while (lVar28 < lVar41);
      }
    }
    ppSVar14 = (Section **)tcc_malloc(lVar41 << 3);
    pvVar15 = tcc_malloc((long)s->nb_sections << 2);
    iVar26 = s->nb_sections;
    if (iVar26 < 1) {
      local_40._0_4_ = 0;
    }
    else {
      lVar41 = 0;
      local_40._0_4_ = 0;
      do {
        lVar28 = (long)(int)ptr[lVar41];
        pSVar6 = s->sections[lVar28];
        if ((lVar41 == 0) || (pSVar6->sh_name != 0)) {
          *(uint *)((long)pvVar15 + lVar28 * 4) = (uint)local_40;
          ppSVar14[(int)(uint)local_40] = pSVar6;
          local_40._0_4_ = (uint)local_40 + 1;
        }
        else {
          *(undefined4 *)((long)pvVar15 + lVar28 * 4) = 0;
          lVar28 = (long)iVar26;
          iVar26 = iVar26 + -1;
          ppSVar14[lVar28 + -1] = pSVar6;
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 < s->nb_sections);
      if (0 < (int)(uint)local_40) {
        uVar30 = 0;
        do {
          pSVar6 = ppSVar14[uVar30];
          if ((pSVar6 != (Section *)0x0) && (pSVar6->sh_num = (int)uVar30, pSVar6->sh_type == 4)) {
            pSVar6->sh_info = *(int *)((long)pvVar15 + (long)pSVar6->sh_info * 4);
          }
          uVar30 = uVar30 + 1;
        } while ((uint)local_40 != uVar30);
      }
    }
    pSVar6 = symtab_section;
    uVar10 = symtab_section->data_offset;
    if (0x18 < (long)uVar10) {
      puVar29 = symtab_section->data;
      puVar32 = puVar29 + 0x18;
      do {
        if ((ushort)(*(ushort *)(puVar32 + 6) - 1) < 0xfeff) {
          *(undefined2 *)(puVar32 + 6) =
               *(undefined2 *)((long)pvVar15 + (ulong)*(ushort *)(puVar32 + 6) * 4);
          uVar10 = pSVar6->data_offset;
          puVar29 = pSVar6->data;
        }
        puVar32 = puVar32 + 0x18;
      } while (puVar32 < puVar29 + uVar10);
    }
    if (s->static_link == 0) {
      pSVar6 = s->dynsym;
      uVar10 = pSVar6->data_offset;
      if (0x18 < (long)uVar10) {
        puVar32 = pSVar6->data + 0x18;
        do {
          if ((ushort)(*(ushort *)(puVar32 + 6) - 1) < 0xfeff) {
            *(undefined2 *)(puVar32 + 6) =
                 *(undefined2 *)((long)pvVar15 + (ulong)*(ushort *)(puVar32 + 6) * 4);
            pSVar6 = s->dynsym;
            uVar10 = pSVar6->data_offset;
          }
          puVar32 = puVar32 + 0x18;
        } while (puVar32 < pSVar6->data + uVar10);
      }
    }
    if (0 < s->nb_sections) {
      lVar41 = 0;
      do {
        ptr[lVar41] = (int)lVar41;
        lVar41 = lVar41 + 1;
      } while (lVar41 < s->nb_sections);
    }
    tcc_free(s->sections);
    s->sections = ppSVar14;
    s->nb_sections = (uint)local_40;
    tcc_free(pvVar15);
    if ((uVar36 == 2) && (s->static_link != 0)) {
      fill_got(s);
    }
    else {
      pSVar6 = s->got;
      if ((pSVar6 != (Section *)0x0) && (0 < (long)pSVar6->reloc->data_offset)) {
        plVar13 = (long *)pSVar6->reloc->data;
        do {
          lVar41 = plVar13[1];
          if ((int)lVar41 == 8) {
            puVar32 = symtab_section->data;
            lVar28 = 0;
            if ((int)((ulong)lVar41 >> 0x20) < s->nb_sym_attrs) {
              lVar28 = lVar41 >> 0x20;
            }
            if (*plVar13 - pSVar6->sh_addr != (ulong)s->sym_attrs[lVar28].got_offset) {
              tcc_error_noabort("huh");
            }
            plVar13[1] = 8;
            plVar13[2] = *(long *)(puVar32 + (lVar41 >> 0x20) * 0x18 + 8);
            pSVar6 = s->got;
          }
          plVar13 = plVar13 + 3;
        } while (plVar13 < pSVar6->reloc->data + pSVar6->reloc->data_offset);
      }
    }
  }
  uVar36 = 0x1ff;
  if (s->output_type == 4) {
    uVar36 = 0x1b6;
  }
  unlink(filename);
  iVar26 = open(filename,0x241,(ulong)uVar36);
  if (iVar26 < 0) {
    tcc_error_noabort("could not write \'%s\'",filename);
    iVar26 = -1;
  }
  else {
    __s = fdopen(iVar26,"wb");
    if (s->verbose != 0) {
      printf("<- %s\n",filename);
    }
    if (s->output_format == 0) {
      iVar26 = s->nb_sections;
      ehdr.e_shoff = 0;
      ehdr.e_flags = 0;
      ehdr.e_ehsize = 0;
      ehdr.e_phentsize = 0;
      ehdr.e_entry = 0;
      ehdr.e_phoff = 0;
      ehdr.e_type = 0;
      ehdr.e_machine = 0;
      ehdr.e_version = 0;
      ehdr.e_ident[0] = '\0';
      ehdr.e_ident[1] = '\0';
      ehdr.e_ident[2] = '\0';
      ehdr.e_ident[3] = '\0';
      ehdr.e_ident[4] = '\0';
      ehdr.e_ident[5] = '\0';
      ehdr.e_ident[6] = '\0';
      ehdr.e_ident[7] = '\0';
      if (iVar35 != 0) {
        ehdr.e_shoff = 0x38000000000000;
        ehdr.e_entry = 0x40;
        ehdr._48_8_ = uVar12;
      }
      uStack_e8 = 0x10102464c457f;
      if (s->output_type == 3) {
        ehdr.e_ident[8] = '\x03';
        ehdr.e_ident[9] = '\0';
        ehdr.e_ident[10] = '\0';
        ehdr.e_ident[0xb] = '\0';
        ehdr.e_ident[0xc] = '\0';
        ehdr.e_ident[0xd] = '\0';
        ehdr.e_ident[0xe] = '\0';
        ehdr.e_ident[0xf] = '\0';
        ehdr._16_8_ = text_section->sh_addr;
LAB_00112043:
      }
      else {
        if (s->output_type != 4) {
          ehdr.e_ident[8] = '\x02';
          ehdr.e_ident[9] = '\0';
          ehdr.e_ident[10] = '\0';
          ehdr.e_ident[0xb] = '\0';
          ehdr.e_ident[0xc] = '\0';
          ehdr.e_ident[0xd] = '\0';
          ehdr.e_ident[0xe] = '\0';
          ehdr.e_ident[0xf] = '\0';
          ehdr._16_8_ = get_elf_sym_addr(s,"_start",1);
          goto LAB_00112043;
        }
        ehdr.e_ident[8] = '\x01';
        ehdr.e_ident[9] = '\0';
      }
      ehdr.e_ident[10] = '>';
      ehdr.e_ident[0xb] = '\0';
      ehdr.e_ident[0xc] = '\x01';
      ehdr.e_ident[0xd] = '\0';
      ehdr.e_ident[0xe] = '\0';
      ehdr.e_ident[0xf] = '\0';
      ehdr.e_phoff = (Elf64_Off)(int)(uVar34 + 3 & 0xfffffffc);
      ehdr.e_shoff._0_6_ = CONCAT24(0x40,(undefined4)ehdr.e_shoff);
      ehdr.e_flags._2_2_ = 0x40;
      ehdr.e_ehsize = (Elf64_Half)iVar26;
      ehdr.e_phentsize = ehdr.e_ehsize - 1;
      fwrite(&uStack_e8,1,0x40,__s);
      fwrite(local_70,1,uVar39,__s);
      pSVar6 = symtab_section;
      uVar36 = (uint)(symtab_section->data_offset / 0x18);
      uVar10 = (long)(int)uVar36 * 0x18;
      __src = (undefined8 *)tcc_malloc(uVar10);
      pvVar15 = tcc_malloc((long)(int)uVar36 * 4);
      puVar16 = __src;
      if (0 < (int)uVar36) {
        pbVar22 = pSVar6->data + 4;
        uVar12 = 0;
        do {
          if (*pbVar22 < 0x10) {
            *(int *)((long)pvVar15 + uVar12 * 4) =
                 (int)((ulong)((long)puVar16 - (long)__src) >> 3) * -0x55555555;
            puVar16[2] = *(undefined8 *)(pbVar22 + 0xc);
            uVar19 = *(undefined8 *)(pbVar22 + 4);
            *puVar16 = *(undefined8 *)(pbVar22 + -4);
            puVar16[1] = uVar19;
            puVar16 = puVar16 + 3;
          }
          uVar12 = uVar12 + 1;
          pbVar22 = pbVar22 + 0x18;
        } while ((uVar36 & 0x7fffffff) != uVar12);
      }
      if (pSVar6->sh_size != 0) {
        pSVar6->sh_info = (int)((ulong)((long)puVar16 - (long)__src) >> 3) * -0x55555555;
      }
      puVar32 = pSVar6->data;
      if (0 < (int)uVar36) {
        pbVar22 = puVar32 + 4;
        uVar12 = 0;
        do {
          if (0xf < *pbVar22) {
            *(int *)((long)pvVar15 + uVar12 * 4) =
                 (int)((ulong)((long)puVar16 - (long)__src) >> 3) * -0x55555555;
            puVar16[2] = *(undefined8 *)(pbVar22 + 0xc);
            uVar19 = *(undefined8 *)(pbVar22 + 4);
            *puVar16 = *(undefined8 *)(pbVar22 + -4);
            puVar16[1] = uVar19;
            puVar16 = puVar16 + 3;
          }
          uVar12 = uVar12 + 1;
          pbVar22 = pbVar22 + 0x18;
        } while ((uVar36 & 0x7fffffff) != uVar12);
        puVar32 = pSVar6->data;
      }
      memcpy(puVar32,__src,uVar10);
      tcc_free(__src);
      iVar26 = s->nb_sections;
      if (1 < iVar26) {
        lVar41 = 1;
        do {
          pSVar8 = s->sections[lVar41];
          if (((pSVar8->sh_type == 4) && (pSVar8->link == pSVar6)) &&
             (0 < (long)pSVar8->data_offset)) {
            puVar32 = pSVar8->data;
            do {
              *(ulong *)(puVar32 + 8) =
                   (long)(int)*(long *)(puVar32 + 8) +
                   ((ulong)*(uint *)((long)pvVar15 + (*(long *)(puVar32 + 8) >> 0x20) * 4) << 0x20);
              puVar32 = puVar32 + 0x18;
            } while (puVar32 < pSVar8->data + pSVar8->data_offset);
            iVar26 = s->nb_sections;
          }
          lVar41 = lVar41 + 1;
        } while (lVar41 < iVar26);
      }
      tcc_free(pvVar15);
      iVar26 = s->nb_sections;
      if (1 < iVar26) {
        lVar41 = 1;
        do {
          pSVar6 = s->sections[(int)ptr[lVar41]];
          if (pSVar6->sh_type != 8) {
            uVar12 = (ulong)(int)uVar23;
            if (uVar12 < pSVar6->sh_offset) {
              do {
                fputc(0,__s);
                uVar12 = uVar12 + 1;
              } while (uVar12 < pSVar6->sh_offset);
              uVar23 = (uint)uVar12;
            }
            iVar26 = (int)pSVar6->sh_size;
            if (iVar26 != 0) {
              fwrite(pSVar6->data,1,(long)iVar26,__s);
            }
            uVar23 = uVar23 + iVar26;
            iVar26 = s->nb_sections;
          }
          lVar41 = lVar41 + 1;
        } while (lVar41 < iVar26);
      }
      lVar41 = ehdr.e_phoff - (long)(int)uVar23;
      if ((ulong)(long)(int)uVar23 <= ehdr.e_phoff && lVar41 != 0) {
        do {
          fputc(0,__s);
          lVar41 = lVar41 + -1;
        } while (lVar41 != 0);
        iVar26 = s->nb_sections;
      }
      if (0 < iVar26) {
        lVar41 = 0;
        do {
          local_108 = 0;
          lStack_100 = 0;
          local_118 = 0;
          uStack_110 = 0;
          local_128 = 0;
          uStack_120 = 0;
          local_138 = 0;
          lStack_130 = 0;
          pSVar6 = s->sections[lVar41];
          if (pSVar6 != (Section *)0x0) {
            local_138 = CONCAT44(pSVar6->sh_type,pSVar6->sh_name);
            lStack_130 = (long)pSVar6->sh_flags;
            lStack_100 = (long)pSVar6->sh_entsize;
            uStack_110._0_4_ = 0;
            if (pSVar6->link != (Section *)0x0) {
              uStack_110._0_4_ = pSVar6->link->sh_num;
            }
            uStack_110 = CONCAT44(pSVar6->sh_info,(int)uStack_110);
            local_108 = (long)pSVar6->sh_addralign;
            local_128 = pSVar6->sh_addr;
            uStack_120 = pSVar6->sh_offset;
            local_118 = pSVar6->sh_size;
          }
          fwrite(&local_138,1,0x40,__s);
          lVar41 = lVar41 + 1;
        } while (lVar41 < s->nb_sections);
      }
    }
    else {
      iVar26 = s->nb_sections;
      if (1 < iVar26) {
        iVar35 = 0;
        lVar41 = 1;
        do {
          pSVar6 = s->sections[(int)ptr[lVar41]];
          if ((pSVar6->sh_type != 8) && ((pSVar6->sh_flags & 2) != 0)) {
            uVar12 = (ulong)iVar35;
            if (uVar12 < pSVar6->sh_offset) {
              do {
                fputc(0,__s);
                uVar12 = uVar12 + 1;
              } while (uVar12 < pSVar6->sh_offset);
              iVar35 = (int)uVar12;
            }
            iVar26 = (int)pSVar6->sh_size;
            fwrite(pSVar6->data,1,(long)iVar26,__s);
            iVar35 = iVar26 + iVar35;
            iVar26 = s->nb_sections;
          }
          lVar41 = lVar41 + 1;
        } while (lVar41 < iVar26);
      }
    }
    fclose(__s);
    iVar26 = 0;
  }
  s->nb_sections = (int)local_f0;
LAB_0011240c:
  tcc_free(ptr);
  tcc_free(local_70);
  return iVar26;
}

Assistant:

LIBTCCAPI int tcc_output_file(TCCState* s, const char* filename) {
  int ret;
#ifdef TCC_TARGET_PE
  if (s->output_type != TCC_OUTPUT_OBJ) {
    ret = pe_output_file(s, filename);
  } else
#endif
    ret = elf_output_file(s, filename);
  return ret;
}